

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

void SEIUnit::updateMetadataPts(uint8_t *metadataPtsPtr,int64_t pts)

{
  *metadataPtsPtr = (byte)((ulong)pts >> 0x1e) & 7;
  metadataPtsPtr[1] = (byte)((ulong)pts >> 0x17) | 0x80;
  metadataPtsPtr[2] = (uint8_t)((ulong)pts >> 0xf);
  metadataPtsPtr[3] = (byte)((ulong)pts >> 8) | 0x80;
  metadataPtsPtr[4] = (uint8_t)pts;
  return;
}

Assistant:

void SEIUnit::updateMetadataPts(uint8_t* metadataPtsPtr, const int64_t pts)
{
    metadataPtsPtr[0] = (pts >> 30) & 0x07;

    auto val = static_cast<uint16_t>((pts >> 15) & 0x7fff);
    metadataPtsPtr[1] = 0x80 + (val >> 8);
    metadataPtsPtr[2] = val & 0xff;

    val = static_cast<uint16_t>(pts & 0x7fff);
    metadataPtsPtr[3] = 0x80 + (val >> 8);
    metadataPtsPtr[4] = val & 0xff;
}